

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLoc.cpp
# Opt level: O1

LocationList * __thiscall
llvm::DWARFDebugLoc::getLocationListAtOffset(DWARFDebugLoc *this,uint64_t Offset)

{
  LocationList *pLVar1;
  LocationList *pLVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar6;
  ulong uVar5;
  
  pLVar1 = (LocationList *)
           (this->Locations).super_SmallVectorImpl<llvm::DWARFDebugLoc::LocationList>.
           super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::LocationList,_false>.
           super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::LocationList,_void>.
           super_SmallVectorBase.BeginX;
  uVar3 = (ulong)(this->Locations).super_SmallVectorImpl<llvm::DWARFDebugLoc::LocationList>.
                 super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::LocationList,_false>.
                 super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::LocationList,_void>.
                 super_SmallVectorBase.Size;
  pLVar2 = pLVar1;
  uVar5 = uVar3;
  if (uVar3 != 0) {
    do {
      uVar4 = uVar5 >> 1;
      uVar6 = uVar4;
      if (pLVar2[uVar4].Offset < Offset) {
        uVar6 = ~uVar4 + uVar5;
        pLVar2 = pLVar2 + uVar4 + 1;
      }
      uVar5 = uVar6;
    } while (0 < (long)uVar6);
  }
  if ((pLVar2 == pLVar1 + uVar3) || (pLVar2->Offset != Offset)) {
    pLVar2 = (LocationList *)0x0;
  }
  return pLVar2;
}

Assistant:

DWARFDebugLoc::LocationList const *
DWARFDebugLoc::getLocationListAtOffset(uint64_t Offset) const {
  auto It = partition_point(
      Locations, [=](const LocationList &L) { return L.Offset < Offset; });
  if (It != Locations.end() && It->Offset == Offset)
    return &(*It);
  return nullptr;
}